

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O1

int p2sc_string2date(char *iso_date,double *d)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  char *local_50;
  long local_48;
  double *local_40;
  long local_38;
  
  lVar8 = _g_ascii_table;
  local_50 = iso_date + -1;
  do {
    bVar2 = local_50[1];
    local_50 = local_50 + 1;
    uVar3 = *(ushort *)(_g_ascii_table + (ulong)bVar2 * 2);
  } while ((uVar3 >> 8 & 1) != 0);
  iVar10 = -1;
  if ((bVar2 != 0) && ((((uVar3 & 8) != 0 || (bVar2 == 0x2d)) || (bVar2 == 0x2b)))) {
    lVar4 = strtol(local_50,&local_50,10);
    if (*local_50 == '-') {
      local_50 = local_50 + 1;
      lVar5 = strtol(local_50,&local_50,10);
      pcVar1 = local_50 + 1;
      if (*local_50 != '-') {
        return -1;
      }
      local_50 = pcVar1;
      local_38 = strtol(pcVar1,&local_50,10);
      lVar12 = lVar4;
    }
    else {
      lVar12 = lVar4 / 10000;
      local_38 = lVar4 % 100;
      lVar5 = (lVar4 % 10000) / 100;
    }
    pcVar1 = local_50 + 1;
    if (*local_50 == 'T') {
      local_50 = pcVar1;
      lVar4 = strtol(pcVar1,&local_50,10);
      local_40 = d;
      if (*local_50 == ':') {
        local_50 = local_50 + 1;
        local_48 = lVar4;
        lVar4 = strtol(local_50,&local_50,10);
        pcVar1 = local_50 + 1;
        if (*local_50 != ':') {
          return -1;
        }
        local_50 = pcVar1;
        lVar6 = strtol(pcVar1,&local_50,10);
      }
      else {
        local_48 = lVar4 / 10000;
        lVar6 = lVar4 % 100;
        lVar4 = (lVar4 % 10000) / 100;
      }
      dVar13 = 0.0;
      if (*local_50 == '.') {
        uVar7 = (ulong)(byte)local_50[1];
        if ((*(byte *)(lVar8 + uVar7 * 2) & 8) == 0) {
          lVar11 = 0;
        }
        else {
          lVar9 = 100000;
          lVar11 = 0;
          do {
            lVar11 = lVar11 + ((long)(char)uVar7 + -0x30) * lVar9;
            lVar9 = lVar9 / 10;
            uVar7 = (ulong)(byte)local_50[2];
            local_50 = local_50 + 1;
          } while ((*(byte *)(lVar8 + uVar7 * 2) & 8) != 0);
        }
        lVar8 = -lVar11;
        if (-1 < lVar6) {
          lVar8 = lVar11;
        }
        dVar13 = (double)lVar8;
      }
      *local_40 = (double)lVar12;
      local_40[1] = (double)lVar5;
      local_40[2] = (double)local_38;
      local_40[3] = (double)local_48;
      local_40[4] = (double)lVar4;
      local_40[5] = dVar13 / 1000000.0 + (double)lVar6;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int p2sc_string2date(const char *iso_date, double d[6]) {
    char *date = (char *) iso_date;
    long year, mon, mday, hour, min, sec, usec = 0;
    long val;

    while (g_ascii_isspace(*date))
        date++;

    if (*date == '\0')
        return -1;

    if (!g_ascii_isdigit(*date) && *date != '-' && *date != '+')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == '-') {
        // YYYY-MM-DD
        year = val;
        date++;
        mon = strtol(date, &date, 10);

        if (*date++ != '-')
            return -1;

        mday = strtol(date, &date, 10);
    } else {
        // YYYYMMDD
        mday = val % 100;
        mon = (val % 10000) / 100;
        year = val / 10000;
    }

    if (*date++ != 'T')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == ':') {
        // hh:mm:ss
        hour = val;
        date++;
        min = strtol(date, &date, 10);

        if (*date++ != ':')
            return -1;

        sec = strtol(date, &date, 10);
    } else {
        // hhmmss
        sec = val % 100;
        min = (val % 10000) / 100;
        hour = val / 10000;
    }

    if (*date == '.') {
        glong mul = 100000;

        while (g_ascii_isdigit(*++date)) {
            usec += (*date - '0') * mul;
            mul /= 10;
        }
        if (sec < 0)
            usec = -usec;
    }

    d[0] = year;
    d[1] = mon;
    d[2] = mday;
    d[3] = hour;
    d[4] = min;
    d[5] = sec + usec / 1000000.;

    return 0;
}